

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall MixedArena::~MixedArena(MixedArena *this)

{
  __pointer_type pMVar1;
  MixedArena *this_local;
  
  clear(this);
  pMVar1 = std::atomic<MixedArena_*>::load(&this->next,memory_order_seq_cst);
  if ((pMVar1 != (__pointer_type)0x0) &&
     (pMVar1 = std::atomic<MixedArena_*>::load(&this->next,memory_order_seq_cst),
     pMVar1 != (__pointer_type)0x0)) {
    ~MixedArena(pMVar1);
    operator_delete(pMVar1,0x30);
  }
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&this->chunks);
  return;
}

Assistant:

~MixedArena() {
    clear();
    if (next.load()) {
      delete next.load();
    }
  }